

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_raw.cpp
# Opt level: O0

void __thiscall ut_raw::erase_node::test_method(erase_node *this)

{
  undefined8 uVar1;
  bool bVar2;
  node_type *pnVar3;
  node_type *pnVar4;
  lazy_ostream *plVar5;
  node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
  *pnVar6;
  const_bf_iterator *pcVar7;
  pointer this_00;
  data_type *pdVar8;
  size_type sVar9;
  basic_cstring<const_char> local_fa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f98;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]> local_f78;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>
  local_f58;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>
  local_f38;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>,_char[8],_const_char_(&)[8]>
  local_f18;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>
  local_ef8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_ed8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
  local_eb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e98;
  assertion_result local_e78;
  basic_cstring<const_char> local_e60;
  basic_cstring<const_char> local_e50;
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  local_e40;
  const_bf_iterator local_de8;
  const_bf_iterator local_d90;
  const_bf_iterator local_d38;
  stringstream local_ce0 [8];
  stringstream tst_2;
  ostream local_cd0 [376];
  basic_cstring<const_char> local_b58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b48;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]> local_b28;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>
  local_b08;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>
  local_ae8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[8],_const_char_(&)[8]>
  local_ac8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>
  local_aa8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_a88;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
  local_a68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a48;
  assertion_result local_a28;
  basic_cstring<const_char> local_a10;
  basic_cstring<const_char> local_a00;
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  local_9f0;
  const_bf_iterator local_998;
  const_bf_iterator local_940;
  const_bf_iterator local_8e8;
  stringstream local_890 [8];
  stringstream tst_1;
  ostream local_880 [376];
  basic_cstring<const_char> local_708;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]> local_6d8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>
  local_6b8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>
  local_698;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[10],_const_char_(&)[10]>
  local_678;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[10],_const_char_(&)[10]>,_char[13],_const_char_(&)[13]>
  local_658;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[10],_const_char_(&)[10]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_638;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[10],_const_char_(&)[10]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
  local_618;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f8;
  assertion_result local_5d8;
  basic_cstring<const_char> local_5c0;
  basic_cstring<const_char> local_5b0;
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  local_5a0;
  const_bf_iterator local_548;
  const_bf_iterator local_4f0;
  const_bf_iterator local_498;
  stringstream local_440 [8];
  stringstream tst;
  ostream local_430 [380];
  undefined4 local_2b4;
  size_type local_2b0;
  basic_cstring<const_char> local_2a8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_298;
  basic_cstring<const_char> local_270;
  basic_cstring<const_char> local_260;
  undefined4 local_24c;
  size_type local_248;
  basic_cstring<const_char> local_240;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_230;
  basic_cstring<const_char> local_208;
  basic_cstring<const_char> local_1f8;
  iterator local_1e8;
  undefined4 local_1cc;
  size_type local_1c8;
  basic_cstring<const_char> local_1c0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1b0;
  basic_cstring<const_char> local_188;
  basic_cstring<const_char> local_178;
  undefined4 local_164;
  size_type local_160;
  basic_cstring<const_char> local_158;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_148;
  basic_cstring<const_char> local_120;
  basic_cstring<const_char> local_110;
  data_type local_fc;
  iterator local_f8;
  data_type local_dc;
  iterator local_d8;
  data_type local_bc;
  iterator local_b8;
  data_type local_9c;
  iterator local_98;
  data_type local_7c;
  iterator local_78;
  data_type local_5c;
  iterator local_58;
  data_type local_2c;
  undefined1 local_28 [8];
  tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> t1;
  erase_node *this_local;
  
  t1._16_8_ = this;
  st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::tree
            ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
  local_2c = 2;
  st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::insert
            ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28,
             &local_2c);
  pnVar3 = st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::root
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28
                     );
  local_5c = 3;
  st_tree::detail::
  node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>::insert
            (&local_58,pnVar3,&local_5c);
  st_tree::detail::
  valmap_iterator_adaptor_random<__gnu_cxx::__normal_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_**,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>,_st_tree::detail::dref_vmap<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>
  ::~valmap_iterator_adaptor_random(&local_58);
  pnVar3 = st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::root
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28
                     );
  local_7c = 5;
  st_tree::detail::
  node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>::insert
            (&local_78,pnVar3,&local_7c);
  st_tree::detail::
  valmap_iterator_adaptor_random<__gnu_cxx::__normal_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_**,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>,_st_tree::detail::dref_vmap<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>
  ::~valmap_iterator_adaptor_random(&local_78);
  pnVar3 = st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::root
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28
                     );
  pnVar4 = st_tree::detail::
           node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>
           ::operator[](pnVar3,0);
  local_9c = 7;
  st_tree::detail::
  node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>::insert
            (&local_98,pnVar4,&local_9c);
  st_tree::detail::
  valmap_iterator_adaptor_random<__gnu_cxx::__normal_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_**,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>,_st_tree::detail::dref_vmap<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>
  ::~valmap_iterator_adaptor_random(&local_98);
  pnVar3 = st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::root
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28
                     );
  pnVar4 = st_tree::detail::
           node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>
           ::operator[](pnVar3,1);
  local_bc = 0xd;
  st_tree::detail::
  node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>::insert
            (&local_b8,pnVar4,&local_bc);
  st_tree::detail::
  valmap_iterator_adaptor_random<__gnu_cxx::__normal_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_**,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>,_st_tree::detail::dref_vmap<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>
  ::~valmap_iterator_adaptor_random(&local_b8);
  pnVar3 = st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::root
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28
                     );
  pnVar4 = st_tree::detail::
           node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>
           ::operator[](pnVar3,0);
  local_dc = 0xb;
  st_tree::detail::
  node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>::insert
            (&local_d8,pnVar4,&local_dc);
  st_tree::detail::
  valmap_iterator_adaptor_random<__gnu_cxx::__normal_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_**,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>,_st_tree::detail::dref_vmap<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>
  ::~valmap_iterator_adaptor_random(&local_d8);
  pnVar3 = st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::root
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28
                     );
  pnVar4 = st_tree::detail::
           node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>
           ::operator[](pnVar3,1);
  local_fc = 0x11;
  st_tree::detail::
  node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>::insert
            (&local_f8,pnVar4,&local_fc);
  st_tree::detail::
  valmap_iterator_adaptor_random<__gnu_cxx::__normal_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_**,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>,_st_tree::detail::dref_vmap<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>
  ::~valmap_iterator_adaptor_random(&local_f8);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_110,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_120);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_110,0x1a2,&local_120);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_148,plVar5,(char (*) [1])0x4059bc);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_158,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    local_160 = st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::size
                          ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                           local_28);
    local_164 = 7;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_148,&local_158,0x1a2,1,2,&local_160,"t1.size()",&local_164,"7");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_148);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_178,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_188);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_178,0x1a3,&local_188);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1b0,plVar5,(char (*) [1])0x4059bc);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    local_1c8 = st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::depth
                          ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                           local_28);
    local_1cc = 3;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_1b0,&local_1c0,0x1a3,1,2,&local_1c8,"t1.depth()",&local_1cc,"3");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1b0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  pnVar3 = st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::root
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28
                     );
  pnVar6 = &st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::root
                      ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                       local_28)->
            super_node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
  ;
  st_tree::detail::
  node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
  ::begin(&local_1e8,pnVar6);
  st_tree::detail::
  node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>::erase
            (pnVar3,&local_1e8);
  st_tree::detail::
  valmap_iterator_adaptor_random<__gnu_cxx::__normal_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_**,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>,_st_tree::detail::dref_vmap<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>
  ::~valmap_iterator_adaptor_random(&local_1e8);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_208);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1f8,0x1a6,&local_208);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_230,plVar5,(char (*) [1])0x4059bc);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    local_248 = st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::size
                          ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                           local_28);
    local_24c = 4;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_230,&local_240,0x1a6,1,2,&local_248,"t1.size()",&local_24c,"4");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_230);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_260,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_270);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_260,0x1a7,&local_270);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_298,plVar5,(char (*) [1])0x4059bc);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2a8,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    local_2b0 = st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::depth
                          ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                           local_28);
    local_2b4 = 3;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_298,&local_2a8,0x1a7,1,2,&local_2b0,"t1.depth()",&local_2b4,"3");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_298);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::stringstream::stringstream(local_440);
  bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
            (&local_498,
             (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
  pcVar7 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28
                     );
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::operator=(pcVar7,&local_498);
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::~b1st_iterator(&local_498);
  while( true ) {
    pcVar7 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_end<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_4f0,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar7,&local_4f0);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_4f0);
    if (!bVar2) break;
    pcVar7 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_548,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar7,&local_548);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_548);
    if (bVar2) {
      std::operator<<(local_430," ");
    }
    pcVar7 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    this_00 = st_tree::detail::
              b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
              ::operator->(pcVar7);
    pdVar8 = st_tree::detail::
             node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>
             ::data(this_00);
    std::ostream::operator<<(local_430,*pdVar8);
    pcVar7 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::operator++(&local_5a0,pcVar7);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_5a0);
  }
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5b0,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_5c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_5b0,0x1a9,&local_5c0);
    std::__cxx11::stringstream::str();
    bVar2 = std::operator==(&local_5f8,"2 5 13 17");
    boost::test_tools::assertion_result::assertion_result(&local_5d8,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_6d8,plVar5,(char (*) [10])"Checking ");
    boost::unit_test::operator<<(&local_6b8,&local_6d8,(char (*) [7])0x4060fe);
    boost::unit_test::operator<<(&local_698,&local_6b8,(char (*) [13])": Expected \"");
    boost::unit_test::operator<<(&local_678,&local_698,(char (*) [10])"2 5 13 17");
    boost::unit_test::operator<<(&local_658,&local_678,(char (*) [13])"\" received \"");
    std::__cxx11::stringstream::str();
    boost::unit_test::operator<<(&local_638,&local_658,&local_6f8);
    boost::unit_test::operator<<(&local_618,&local_638,(char (*) [3])"\"\n");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_708,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::test_tools::tt_detail::report_assertion(&local_5d8,&local_618,&local_708,0x1a9,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[10],_const_char_(&)[10]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
    ::~lazy_ostream_impl(&local_618);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[10],_const_char_(&)[10]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl(&local_638);
    std::__cxx11::string::~string((string *)&local_6f8);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[10],_const_char_(&)[10]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_658);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[10],_const_char_(&)[10]>
    ::~lazy_ostream_impl(&local_678);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_698);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>
    ::~lazy_ostream_impl(&local_6b8);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>::
    ~lazy_ostream_impl(&local_6d8);
    boost::test_tools::assertion_result::~assertion_result(&local_5d8);
    std::__cxx11::string::~string((string *)&local_5f8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::stringstream::~stringstream(local_440);
  std::__cxx11::stringstream::stringstream(local_890);
  bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
            (&local_8e8,
             (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
  pcVar7 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28
                     );
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::operator=(pcVar7,&local_8e8);
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::~b1st_iterator(&local_8e8);
  while( true ) {
    pcVar7 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_end<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_940,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar7,&local_940);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_940);
    if (!bVar2) break;
    pcVar7 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_998,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar7,&local_998);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_998);
    if (bVar2) {
      std::operator<<(local_880," ");
    }
    pcVar7 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    pnVar6 = &st_tree::detail::
              b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
              ::operator->(pcVar7)->
              super_node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
    ;
    sVar9 = st_tree::detail::
            node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
            ::ply(pnVar6);
    std::ostream::operator<<(local_880,sVar9);
    pcVar7 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::operator++(&local_9f0,pcVar7);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_9f0);
  }
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a00,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_a10);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_a00,0x1aa,&local_a10);
    std::__cxx11::stringstream::str();
    bVar2 = std::operator==(&local_a48,"0 1 2 2");
    boost::test_tools::assertion_result::assertion_result(&local_a28,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_b28,plVar5,(char (*) [10])"Checking ");
    boost::unit_test::operator<<(&local_b08,&local_b28,(char (*) [6])"ply()");
    boost::unit_test::operator<<(&local_ae8,&local_b08,(char (*) [13])": Expected \"");
    boost::unit_test::operator<<(&local_ac8,&local_ae8,(char (*) [8])"0 1 2 2");
    boost::unit_test::operator<<(&local_aa8,&local_ac8,(char (*) [13])"\" received \"");
    std::__cxx11::stringstream::str();
    boost::unit_test::operator<<(&local_a88,&local_aa8,&local_b48);
    boost::unit_test::operator<<(&local_a68,&local_a88,(char (*) [3])"\"\n");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b58,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::test_tools::tt_detail::report_assertion(&local_a28,&local_a68,&local_b58,0x1aa,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
    ::~lazy_ostream_impl(&local_a68);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl(&local_a88);
    std::__cxx11::string::~string((string *)&local_b48);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_aa8);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[8],_const_char_(&)[8]>
    ::~lazy_ostream_impl(&local_ac8);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_ae8);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>
    ::~lazy_ostream_impl(&local_b08);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>::
    ~lazy_ostream_impl(&local_b28);
    boost::test_tools::assertion_result::~assertion_result(&local_a28);
    std::__cxx11::string::~string((string *)&local_a48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::stringstream::~stringstream(local_890);
  std::__cxx11::stringstream::stringstream(local_ce0);
  bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
            (&local_d38,
             (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
  pcVar7 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28
                     );
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::operator=(pcVar7,&local_d38);
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::~b1st_iterator(&local_d38);
  while( true ) {
    pcVar7 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_end<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_d90,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar7,&local_d90);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_d90);
    if (!bVar2) break;
    pcVar7 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_de8,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar7,&local_de8);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_de8);
    if (bVar2) {
      std::operator<<(local_cd0," ");
    }
    pcVar7 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    pnVar6 = &st_tree::detail::
              b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
              ::operator->(pcVar7)->
              super_node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
    ;
    sVar9 = st_tree::detail::
            node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
            ::subtree_size(pnVar6);
    std::ostream::operator<<(local_cd0,sVar9);
    pcVar7 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::operator++(&local_e40,pcVar7);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_e40);
  }
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e50,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_e60);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_e50,0x1ab,&local_e60);
    std::__cxx11::stringstream::str();
    bVar2 = std::operator==(&local_e98,"4 3 1 1");
    boost::test_tools::assertion_result::assertion_result(&local_e78,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_f78,plVar5,(char (*) [10])"Checking ");
    boost::unit_test::operator<<(&local_f58,&local_f78,(char (*) [15])"subtree_size()");
    boost::unit_test::operator<<(&local_f38,&local_f58,(char (*) [13])": Expected \"");
    boost::unit_test::operator<<(&local_f18,&local_f38,(char (*) [8])"4 3 1 1");
    boost::unit_test::operator<<(&local_ef8,&local_f18,(char (*) [13])"\" received \"");
    std::__cxx11::stringstream::str();
    boost::unit_test::operator<<(&local_ed8,&local_ef8,&local_f98);
    boost::unit_test::operator<<(&local_eb8,&local_ed8,(char (*) [3])"\"\n");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_fa8,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::test_tools::tt_detail::report_assertion(&local_e78,&local_eb8,&local_fa8,0x1ab,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
    ::~lazy_ostream_impl(&local_eb8);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl(&local_ed8);
    std::__cxx11::string::~string((string *)&local_f98);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_ef8);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>,_char[8],_const_char_(&)[8]>
    ::~lazy_ostream_impl(&local_f18);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_f38);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>
    ::~lazy_ostream_impl(&local_f58);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>::
    ~lazy_ostream_impl(&local_f78);
    boost::test_tools::assertion_result::~assertion_result(&local_e78);
    std::__cxx11::string::~string((string *)&local_e98);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::stringstream::~stringstream(local_ce0);
  st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::~tree
            ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(erase_node) {
    tree<int> t1;
    t1.insert(2);
    t1.root().insert(3);
    t1.root().insert(5);
    t1.root()[0].insert(7);
    t1.root()[1].insert(13);
    t1.root()[0].insert(11);
    t1.root()[1].insert(17);
    BOOST_CHECK_EQUAL(t1.size(), 7);
    BOOST_CHECK_EQUAL(t1.depth(), 3);

    t1.root().erase(t1.root().begin());
    BOOST_CHECK_EQUAL(t1.size(), 4);
    BOOST_CHECK_EQUAL(t1.depth(), 3);

    CHECK_TREE(t1, data(), "2 5 13 17");
    CHECK_TREE(t1, ply(), "0 1 2 2");
    CHECK_TREE(t1, subtree_size(), "4 3 1 1");
}